

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

size_t ChunkListDiskSize(WebPChunk *chunk_list)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; chunk_list != (WebPChunk *)0x0; chunk_list = chunk_list->next) {
    sVar1 = sVar1 + ((int)(chunk_list->data).size + 1U & 0xfffffffe) + 8;
  }
  return sVar1;
}

Assistant:

size_t ChunkListDiskSize(const WebPChunk* chunk_list) {
  size_t size = 0;
  while (chunk_list != NULL) {
    size += ChunkDiskSize(chunk_list);
    chunk_list = chunk_list->next;
  }
  return size;
}